

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

void __thiscall
pbrt::ImageInfiniteLight::PDF_Le(ImageInfiniteLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Float FVar6;
  undefined1 extraout_var [56];
  Vector3f d;
  Tuple2<pbrt::Point2,_float> local_28;
  undefined1 auVar7 [64];
  
  fVar1 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar2 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar3 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (this->super_LightBase).renderFromLight.mInv.m[0]
                                                  [1])),ZEXT416((uint)fVar1),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][0]));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar3),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][2]));
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (this->super_LightBase).renderFromLight.mInv.m[1]
                                                  [1])),ZEXT416((uint)fVar1),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][0]));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar3),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][2]));
  auVar4 = vunpcklps_avx(auVar4,auVar5);
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (this->super_LightBase).renderFromLight.mInv.m[2]
                                                  [1])),ZEXT416((uint)fVar1),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar3),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]));
  d.super_Tuple3<pbrt::Vector3,_float>.z = -auVar5._0_4_;
  d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar4._0_8_ ^ 0x8000000080000000;
  auVar7._0_8_ = EqualAreaSphereToSquare(d);
  auVar7._8_56_ = extraout_var;
  local_28 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar7._0_16_);
  FVar6 = PiecewiseConstant2D::PDF(&this->distribution,(Point2f *)&local_28);
  *pdfDir = FVar6 / 12.566371;
  *pdfPos = 1.0 / (this->sceneRadius * this->sceneRadius * 3.1415927);
  return;
}

Assistant:

void ImageInfiniteLight::PDF_Le(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    Vector3f wl = -renderFromLight.ApplyInverse(ray.d);
    Float mapPDF = distribution.PDF(EqualAreaSphereToSquare(wl));
    *pdfDir = mapPDF / (4 * Pi);
    *pdfPos = 1 / (Pi * Sqr(sceneRadius));
}